

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::RetreiveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  ostream *this_00;
  char *pcVar4;
  unsigned_long *puVar5;
  uint *puVar6;
  ulong uVar7;
  ulonglong uVar8;
  size_type sVar9;
  reference ppcVar10;
  long lVar11;
  double dVar12;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  float local_55c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  undefined1 local_4b8 [8];
  string cpuflags;
  string local_478;
  undefined1 local_458 [8];
  string cacheSize;
  size_t index;
  char *local_428;
  char *local_420;
  undefined1 local_418 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  undefined1 local_360 [8];
  string cpurev;
  undefined1 local_320 [8];
  string cpuname;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  undefined1 local_220 [8];
  string familyStr;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  string CPUSpeed;
  undefined1 local_178 [4];
  uint NumberOfCoresPerSocket;
  undefined1 local_158 [8];
  string Cores;
  size_type local_130;
  uint64_t NumberOfSockets;
  string local_108;
  _Base_ptr local_e8;
  undefined1 local_e0;
  int local_d4;
  undefined1 local_d0 [4];
  int id;
  undefined1 local_b0 [8];
  string idc;
  set<int,_std::less<int>,_std::allocator<int>_> PhysicalIDs;
  size_t pos;
  size_t fileSize;
  FILE *fd;
  string buffer;
  SystemInformationImplementation *this_local;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  buffer.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&fd);
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    while (iVar3 = feof(__stream), iVar3 == 0) {
      iVar3 = fgetc(__stream);
      std::__cxx11::string::operator+=((string *)&fd,(char)iVar3);
    }
    fclose(__stream);
    std::__cxx11::string::resize((ulong)&fd);
    PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count =
         std::__cxx11::string::find((char *)&fd,0x84d38f);
    while (PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0xffffffffffffffff) {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count =
           std::__cxx11::string::find((char *)&fd,0x84d38f);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&idc.field_2 + 8));
    std::__cxx11::string::string((string *)local_d0,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_b0,this,(string *)local_d0,"physical id",0);
    std::__cxx11::string::~string((string *)local_d0);
    while (this->CurrentPositionInFile != 0xffffffffffffffff) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_d4 = atoi(pcVar4);
      pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&idc.field_2 + 8)
                          ,&local_d4);
      local_e8 = (_Base_ptr)pVar13.first._M_node;
      local_e0 = pVar13.second;
      std::__cxx11::string::string((string *)&NumberOfSockets,(string *)&fd);
      ExtractValueFromCpuInfoFile
                (&local_108,this,(string *)&NumberOfSockets,"physical id",
                 this->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&NumberOfSockets);
    }
    local_130 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           ((long)&idc.field_2 + 8));
    Cores.field_2._8_8_ = 1;
    puVar5 = std::max<unsigned_long>(&local_130,(unsigned_long *)(Cores.field_2._M_local_buf + 8));
    local_130 = *puVar5;
    std::__cxx11::string::string((string *)local_178,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_158,this,(string *)local_178,"cpu cores",0);
    std::__cxx11::string::~string((string *)local_178);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    CPUSpeed.field_2._12_4_ = atoi(pcVar4);
    CPUSpeed.field_2._8_4_ = 1;
    puVar6 = std::max<unsigned_int>
                       ((uint *)(CPUSpeed.field_2._M_local_buf + 0xc),
                        (uint *)(CPUSpeed.field_2._M_local_buf + 8));
    CPUSpeed.field_2._12_4_ = *puVar6;
    this->NumberOfPhysicalCPU = CPUSpeed.field_2._12_4_ * (int)local_130;
    if (this->NumberOfPhysicalCPU == 0) {
      this->NumberOfPhysicalCPU = 1;
    }
    (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
         this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;
    std::__cxx11::string::string((string *)&local_1c0,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_1a0,this,&local_1c0,"cpu MHz",0);
    std::__cxx11::string::~string((string *)&local_1c0);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      dVar12 = atof(pcVar4);
      this->CPUSpeedInMHz = (float)dVar12;
    }
    else {
      std::__cxx11::string::string((string *)(familyStr.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                (&local_1e0,this,(string *)((long)&familyStr.field_2 + 8),"Cpu0ClkTck",0);
      std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)(familyStr.field_2._M_local_buf + 8));
      pcVar4 = (char *)std::__cxx11::string::c_str();
      uVar8 = strtoull(pcVar4,(char **)0x0,0x10);
      local_55c = (float)uVar8;
      this->CPUSpeedInMHz = local_55c / 1e+06;
    }
    std::__cxx11::string::string((string *)&local_240,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_220,this,&local_240,"cpu family",0);
    std::__cxx11::string::~string((string *)&local_240);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_280,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_260,this,&local_280,"CPU architecture",0);
      std::__cxx11::string::operator=((string *)local_220,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar3 = atoi(pcVar4);
    (this->ChipID).Family = iVar3;
    std::__cxx11::string::string((string *)&local_2c0,(string *)&fd);
    ExtractValueFromCpuInfoFile(&local_2a0,this,&local_2c0,"vendor_id",0);
    std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    FindManufacturer(this,(string *)local_220);
    if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_220,"PA-RISC 1.1a");
      if (bVar2) {
        (this->ChipID).Family = 0x11a;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_220,"PA-RISC 2.0");
        if (bVar2) {
          (this->ChipID).Family = 0x200;
        }
      }
    }
    std::__cxx11::string::string((string *)(cpuname.field_2._M_local_buf + 8),(string *)&fd);
    ExtractValueFromCpuInfoFile(&local_2e0,this,(string *)((long)&cpuname.field_2 + 8),"model",0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar3 = atoi(pcVar4);
    (this->ChipID).Model = iVar3;
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)(cpuname.field_2._M_local_buf + 8));
    bVar2 = RetrieveClassicalCPUIdentity(this);
    if (!bVar2) {
      std::__cxx11::string::string((string *)(cpurev.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                ((string *)local_320,this,(string *)((long)&cpurev.field_2 + 8),"cpu",0);
      std::__cxx11::string::~string((string *)(cpurev.field_2._M_local_buf + 8));
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&(this->ChipID).ProcessorName,(string *)local_320)
        ;
      }
      std::__cxx11::string::~string((string *)local_320);
    }
    std::__cxx11::string::string((string *)&local_380,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_360,this,&local_380,"stepping",0);
    std::__cxx11::string::~string((string *)&local_380);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_3c0,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_3a0,this,&local_3c0,"CPU revision",0);
      std::__cxx11::string::operator=((string *)local_360,(string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar3 = atoi(pcVar4);
    (this->ChipID).Revision = iVar3;
    std::__cxx11::string::string
              ((string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&fd);
    ExtractValueFromCpuInfoFile
              (&local_3e0,this,
               (string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"model name",0);
    std::__cxx11::string::operator=((string *)&(this->ChipID).ModelName,(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string
              ((string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418);
    local_420 = "cache size";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418,&local_420);
    local_428 = "I-cache";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418,&local_428);
    index = (size_t)anon_var_dwarf_cd411b;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418,(value_type *)&index
              );
    (this->Features).L1CacheSize = 0;
    for (cacheSize.field_2._8_8_ = 0; uVar1 = cacheSize.field_2._8_8_,
        sVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418),
        (ulong)uVar1 < sVar9; cacheSize.field_2._8_8_ = cacheSize.field_2._8_8_ + 1) {
      std::__cxx11::string::string((string *)&local_478,(string *)&fd);
      ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418,
                            cacheSize.field_2._8_8_);
      ExtractValueFromCpuInfoFile((string *)local_458,this,&local_478,*ppcVar10,0);
      std::__cxx11::string::~string((string *)&local_478);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        lVar11 = std::__cxx11::string::find(local_458,0x84d442);
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)((long)&cpuflags.field_2 + 8),(ulong)local_458);
          std::__cxx11::string::operator=
                    ((string *)local_458,(string *)(cpuflags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(cpuflags.field_2._M_local_buf + 8));
        }
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar3 = atoi(pcVar4);
        (this->Features).L1CacheSize = iVar3 + (this->Features).L1CacheSize;
      }
      std::__cxx11::string::~string((string *)local_458);
    }
    std::__cxx11::string::string((string *)&local_4d8,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_4b8,this,&local_4d8,"flags",0);
    std::__cxx11::string::~string((string *)&local_4d8);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::operator+(&local_518," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8)
      ;
      std::operator+(&local_4f8,&local_518," ");
      std::__cxx11::string::operator=((string *)local_4b8,(string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d446);
      if (lVar11 != -1) {
        (this->Features).HasFPU = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d44c);
      if (lVar11 != -1) {
        (this->Features).HasTSC = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d452);
      if (lVar11 != -1) {
        (this->Features).HasMMX = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d458);
      if (lVar11 != -1) {
        (this->Features).HasSSE = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d45e);
      if (lVar11 != -1) {
        (this->Features).HasSSE2 = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d465);
      if (lVar11 != -1) {
        (this->Features).HasAPIC = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d46c);
      if (lVar11 != -1) {
        (this->Features).HasCMOV = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d473);
      if (lVar11 != -1) {
        (this->Features).HasMTRR = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d47a);
      if (lVar11 != -1) {
        (this->Features).HasACPI = true;
      }
      lVar11 = std::__cxx11::string::find(local_4b8,0x84d481);
      if (lVar11 != -1) {
        (this->Features).ExtendedFeatures.Has3DNow = true;
      }
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_4b8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_418);
    std::__cxx11::string::~string((string *)local_360);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_b0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&idc.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)&fd);
  return this_local._7_1_;
}

Assistant:

bool SystemInformationImplementation::RetreiveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE* fd = fopen("/proc/cpuinfo", "r");
  if (!fd) {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
  }

  size_t fileSize = 0;
  while (!feof(fd)) {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
  }
  fclose(fd);
  buffer.resize(fileSize - 2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and SMT)
  size_t pos = buffer.find("processor\t");
  while (pos != std::string::npos) {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t", pos + 1);
  }

#ifdef __linux
  // Count sockets.
  std::set<int> PhysicalIDs;
  std::string idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id");
  while (this->CurrentPositionInFile != std::string::npos) {
    int id = atoi(idc.c_str());
    PhysicalIDs.insert(id);
    idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id",
                                            this->CurrentPositionInFile + 1);
  }
  uint64_t NumberOfSockets = PhysicalIDs.size();
  NumberOfSockets = std::max(NumberOfSockets, (uint64_t)1);
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string Cores = this->ExtractValueFromCpuInfoFile(buffer, "cpu cores");
  unsigned int NumberOfCoresPerSocket = (unsigned int)atoi(Cores.c_str());
  NumberOfCoresPerSocket = std::max(NumberOfCoresPerSocket, 1u);
  this->NumberOfPhysicalCPU =
    NumberOfCoresPerSocket * (unsigned int)NumberOfSockets;

#else // __CYGWIN__
  // does not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu count");
  this->NumberOfPhysicalCPU = this->NumberOfLogicalCPU =
    atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if (this->NumberOfPhysicalCPU <= 0) {
    this->NumberOfPhysicalCPU = 1;
  }
  // LogicalProcessorsPerPhysical>1 => SMT.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical =
    this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "cpu MHz");
  if (!CPUSpeed.empty()) {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
  }
#ifdef __linux
  else {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "Cpu0ClkTck");
    this->CPUSpeedInMHz =
      static_cast<float>(strtoull(CPUSpeed.c_str(), 0, 16)) / 1000000.0f;
  }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu family");
  if (familyStr.empty()) {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer, "CPU architecture");
  }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer, "vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP) {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
  }

  // Chip Model
  this->ChipID.Model =
    atoi(this->ExtractValueFromCpuInfoFile(buffer, "model").c_str());
  if (!this->RetrieveClassicalCPUIdentity()) {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer, "cpu");
    if (!cpuname.empty()) {
      this->ChipID.ProcessorName = cpuname;
    }
  }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer, "stepping");
  if (cpurev.empty()) {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer, "CPU revision");
  }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName =
    this->ExtractValueFromCpuInfoFile(buffer, "model name");

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache");    // e.g. PA-RISC
  cachename.push_back("D-cache");    // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (size_t index = 0; index < cachename.size(); index++) {
    std::string cacheSize =
      this->ExtractValueFromCpuInfoFile(buffer, cachename[index]);
    if (!cacheSize.empty()) {
      pos = cacheSize.find(" KB");
      if (pos != std::string::npos) {
        cacheSize = cacheSize.substr(0, pos);
      }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
    }
  }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer, "flags");
  if (!cpurev.empty()) {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ") != std::string::npos)) {
      this->Features.HasFPU = true;
    }
    if ((cpuflags.find(" tsc ") != std::string::npos)) {
      this->Features.HasTSC = true;
    }
    if ((cpuflags.find(" mmx ") != std::string::npos)) {
      this->Features.HasMMX = true;
    }
    if ((cpuflags.find(" sse ") != std::string::npos)) {
      this->Features.HasSSE = true;
    }
    if ((cpuflags.find(" sse2 ") != std::string::npos)) {
      this->Features.HasSSE2 = true;
    }
    if ((cpuflags.find(" apic ") != std::string::npos)) {
      this->Features.HasAPIC = true;
    }
    if ((cpuflags.find(" cmov ") != std::string::npos)) {
      this->Features.HasCMOV = true;
    }
    if ((cpuflags.find(" mtrr ") != std::string::npos)) {
      this->Features.HasMTRR = true;
    }
    if ((cpuflags.find(" acpi ") != std::string::npos)) {
      this->Features.HasACPI = true;
    }
    if ((cpuflags.find(" 3dnow ") != std::string::npos)) {
      this->Features.ExtendedFeatures.Has3DNow = true;
    }
  }

  return true;
}